

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::ShouldUseColor(bool stdout_is_tty)

{
  bool bVar1;
  char *__s;
  bool bVar2;
  bool bVar3;
  bool local_ab;
  bool local_aa;
  bool local_9a;
  bool local_99;
  allocator<char> local_91;
  string local_90;
  byte local_6b;
  byte local_6a;
  allocator<char> local_69;
  string local_68;
  undefined1 local_41;
  char *pcStack_40;
  bool term_supports_color;
  char *term;
  char *gtest_color;
  string c;
  bool stdout_is_tty_local;
  
  c.field_2._M_local_buf[0xe] = stdout_is_tty;
  std::__cxx11::string::string((string *)&gtest_color,(string *)FLAGS_gtest_color_abi_cxx11_);
  term = (char *)std::__cxx11::string::c_str();
  bVar2 = String::CaseInsensitiveCStringEquals(term,"auto");
  if (bVar2) {
    pcStack_40 = posix::GetEnv("TERM");
    local_6a = 0;
    local_6b = 0;
    bVar1 = false;
    bVar2 = false;
    local_99 = false;
    if (pcStack_40 != (char *)0x0) {
      bVar3 = String::CStringEquals(pcStack_40,"xterm");
      local_9a = true;
      if (!bVar3) {
        bVar3 = String::CStringEquals(pcStack_40,"xterm-color");
        local_9a = true;
        if (!bVar3) {
          bVar3 = String::CStringEquals(pcStack_40,"xterm-kitty");
          local_9a = true;
          if (!bVar3) {
            bVar3 = String::CStringEquals(pcStack_40,"alacritty");
            local_9a = true;
            if (!bVar3) {
              bVar3 = String::CStringEquals(pcStack_40,"screen");
              local_9a = true;
              if (!bVar3) {
                bVar3 = String::CStringEquals(pcStack_40,"tmux");
                local_9a = true;
                if (!bVar3) {
                  bVar3 = String::CStringEquals(pcStack_40,"rxvt-unicode");
                  local_9a = true;
                  if (!bVar3) {
                    bVar3 = String::CStringEquals(pcStack_40,"linux");
                    local_9a = true;
                    if (!bVar3) {
                      bVar3 = String::CStringEquals(pcStack_40,"cygwin");
                      __s = pcStack_40;
                      local_9a = true;
                      if (!bVar3) {
                        std::allocator<char>::allocator();
                        local_6a = 1;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_68,__s,&local_69);
                        local_6b = 1;
                        std::allocator<char>::allocator();
                        bVar1 = true;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_90,"-256color",&local_91);
                        bVar2 = true;
                        local_9a = String::EndsWithCaseInsensitive(&local_68,&local_90);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      local_99 = local_9a;
    }
    if (bVar2) {
      std::__cxx11::string::~string((string *)&local_90);
    }
    if (bVar1) {
      std::allocator<char>::~allocator(&local_91);
    }
    if ((local_6b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_68);
    }
    if ((local_6a & 1) != 0) {
      std::allocator<char>::~allocator(&local_69);
    }
    local_41 = local_99;
    local_aa = false;
    if ((c.field_2._M_local_buf[0xe] & 1U) != 0) {
      local_aa = (bool)local_41;
    }
    c.field_2._M_local_buf[0xf] = local_aa;
  }
  else {
    bVar2 = String::CaseInsensitiveCStringEquals(term,"yes");
    local_ab = true;
    if (!bVar2) {
      bVar2 = String::CaseInsensitiveCStringEquals(term,"true");
      local_ab = true;
      if (!bVar2) {
        bVar2 = String::CaseInsensitiveCStringEquals(term,"t");
        local_ab = true;
        if (!bVar2) {
          local_ab = String::CStringEquals(term,"1");
        }
      }
    }
    c.field_2._M_local_buf[0xf] = local_ab;
  }
  std::__cxx11::string::~string((string *)&gtest_color);
  return (bool)(c.field_2._M_local_buf[0xf] & 1);
}

Assistant:

bool ShouldUseColor(bool stdout_is_tty) {
  std::string c = GTEST_FLAG_GET(color);
  const char* const gtest_color = c.c_str();

  if (String::CaseInsensitiveCStringEquals(gtest_color, "auto")) {
#if defined(GTEST_OS_WINDOWS) && !defined(GTEST_OS_WINDOWS_MINGW)
    // On Windows the TERM variable is usually not set, but the
    // console there does support colors.
    return stdout_is_tty;
#else
    // On non-Windows platforms, we rely on the TERM variable.
    const char* const term = posix::GetEnv("TERM");
    const bool term_supports_color =
        term != nullptr && (String::CStringEquals(term, "xterm") ||
                            String::CStringEquals(term, "xterm-color") ||
                            String::CStringEquals(term, "xterm-kitty") ||
                            String::CStringEquals(term, "alacritty") ||
                            String::CStringEquals(term, "screen") ||
                            String::CStringEquals(term, "tmux") ||
                            String::CStringEquals(term, "rxvt-unicode") ||
                            String::CStringEquals(term, "linux") ||
                            String::CStringEquals(term, "cygwin") ||
                            String::EndsWithCaseInsensitive(term, "-256color"));
    return stdout_is_tty && term_supports_color;
#endif  // GTEST_OS_WINDOWS
  }

  return String::CaseInsensitiveCStringEquals(gtest_color, "yes") ||
         String::CaseInsensitiveCStringEquals(gtest_color, "true") ||
         String::CaseInsensitiveCStringEquals(gtest_color, "t") ||
         String::CStringEquals(gtest_color, "1");
  // We take "yes", "true", "t", and "1" as meaning "yes".  If the
  // value is neither one of these nor "auto", we treat it as "no" to
  // be conservative.
}